

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_is_subband_area_of_interest
                   (opj_tcd_t *tcd,OPJ_UINT32 compno,OPJ_UINT32 resno,OPJ_UINT32 bandno,
                   OPJ_UINT32 band_x0,OPJ_UINT32 band_y0,OPJ_UINT32 band_x1,OPJ_UINT32 band_y1)

{
  char cVar1;
  uint b;
  OPJ_UINT32 OVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_image_comp_t *poVar7;
  bool local_9d;
  OPJ_UINT32 local_9c;
  OPJ_UINT32 local_98;
  OPJ_UINT32 local_94;
  OPJ_UINT32 local_90;
  OPJ_UINT32 local_8c;
  OPJ_UINT32 local_88;
  OPJ_UINT32 local_84;
  OPJ_UINT32 local_80;
  OPJ_UINT32 local_7c;
  OPJ_BOOL intersects;
  OPJ_UINT32 tby1;
  OPJ_UINT32 tbx1;
  OPJ_UINT32 tby0;
  OPJ_UINT32 tbx0;
  OPJ_UINT32 y0b;
  OPJ_UINT32 x0b;
  OPJ_UINT32 nb;
  OPJ_UINT32 tcy1;
  OPJ_UINT32 tcx1;
  OPJ_UINT32 tcy0;
  OPJ_UINT32 tcx0;
  opj_image_comp_t *image_comp;
  opj_tcd_tilecomp_t *tilec;
  OPJ_UINT32 filter_margin;
  OPJ_UINT32 band_y0_local;
  OPJ_UINT32 band_x0_local;
  OPJ_UINT32 bandno_local;
  OPJ_UINT32 resno_local;
  OPJ_UINT32 compno_local;
  opj_tcd_t *tcd_local;
  
  b = 3;
  if (tcd->tcp->tccps[compno].qmfbid == 1) {
    b = 2;
  }
  poVar6 = tcd->tcd_image->tiles->comps + compno;
  poVar7 = tcd->image->comps + compno;
  OVar5 = poVar6->x0;
  OVar2 = opj_uint_ceildiv(tcd->win_x0,poVar7->dx);
  local_80 = opj_uint_max(OVar5,OVar2);
  OVar5 = poVar6->y0;
  OVar2 = opj_uint_ceildiv(tcd->win_y0,poVar7->dy);
  local_88 = opj_uint_max(OVar5,OVar2);
  OVar5 = poVar6->x1;
  OVar2 = opj_uint_ceildiv(tcd->win_x1,poVar7->dx);
  local_90 = opj_uint_min(OVar5,OVar2);
  OVar5 = poVar6->y1;
  OVar2 = opj_uint_ceildiv(tcd->win_y1,poVar7->dy);
  local_98 = opj_uint_min(OVar5,OVar2);
  if (resno == 0) {
    local_7c = poVar6->numresolutions - 1;
  }
  else {
    local_7c = poVar6->numresolutions - resno;
  }
  uVar3 = bandno & 1;
  uVar4 = bandno >> 1;
  cVar1 = (char)local_7c;
  if (local_7c != 0) {
    if ((1 << (cVar1 - 1U & 0x1f)) * uVar3 < local_80) {
      local_84 = opj_uint_ceildivpow2(local_80 - (1 << (cVar1 - 1U & 0x1f)) * uVar3,local_7c);
    }
    else {
      local_84 = 0;
    }
    local_80 = local_84;
  }
  if (local_7c != 0) {
    if ((1 << (cVar1 - 1U & 0x1f)) * uVar4 < local_88) {
      local_8c = opj_uint_ceildivpow2(local_88 - (1 << (cVar1 - 1U & 0x1f)) * uVar4,local_7c);
    }
    else {
      local_8c = 0;
    }
    local_88 = local_8c;
  }
  if (local_7c != 0) {
    if ((1 << (cVar1 - 1U & 0x1f)) * uVar3 < local_90) {
      local_94 = opj_uint_ceildivpow2(local_90 - (1 << (cVar1 - 1U & 0x1f)) * uVar3,local_7c);
    }
    else {
      local_94 = 0;
    }
    local_90 = local_94;
  }
  if (local_7c != 0) {
    if ((1 << (cVar1 - 1U & 0x1f)) * uVar4 < local_98) {
      local_9c = opj_uint_ceildivpow2(local_98 - (1 << (cVar1 - 1U & 0x1f)) * uVar4,local_7c);
    }
    else {
      local_9c = 0;
    }
    local_98 = local_9c;
  }
  if (local_80 < b) {
    tbx1 = 0;
  }
  else {
    tbx1 = local_80 - b;
  }
  if (local_88 < b) {
    tby1 = 0;
  }
  else {
    tby1 = local_88 - b;
  }
  OVar5 = opj_uint_adds(local_90,b);
  OVar2 = opj_uint_adds(local_98,b);
  local_9d = false;
  if (((band_x0 < OVar5) && (local_9d = false, band_y0 < OVar2)) &&
     (local_9d = false, tbx1 < band_x1)) {
    local_9d = tby1 < band_y1;
  }
  return (uint)local_9d;
}

Assistant:

OPJ_BOOL opj_tcd_is_subband_area_of_interest(opj_tcd_t *tcd,
        OPJ_UINT32 compno,
        OPJ_UINT32 resno,
        OPJ_UINT32 bandno,
        OPJ_UINT32 band_x0,
        OPJ_UINT32 band_y0,
        OPJ_UINT32 band_x1,
        OPJ_UINT32 band_y1)
{
    /* Note: those values for filter_margin are in part the result of */
    /* experimentation. The value 2 for QMFBID=1 (5x3 filter) can be linked */
    /* to the maximum left/right extension given in tables F.2 and F.3 of the */
    /* standard. The value 3 for QMFBID=0 (9x7 filter) is more suspicious, */
    /* since F.2 and F.3 would lead to 4 instead, so the current 3 might be */
    /* needed to be bumped to 4, in case inconsistencies are found while */
    /* decoding parts of irreversible coded images. */
    /* See opj_dwt_decode_partial_53 and opj_dwt_decode_partial_97 as well */
    OPJ_UINT32 filter_margin = (tcd->tcp->tccps[compno].qmfbid == 1) ? 2 : 3;
    opj_tcd_tilecomp_t *tilec = &(tcd->tcd_image->tiles->comps[compno]);
    opj_image_comp_t* image_comp = &(tcd->image->comps[compno]);
    /* Compute the intersection of the area of interest, expressed in tile coordinates */
    /* with the tile coordinates */
    OPJ_UINT32 tcx0 = opj_uint_max(
                          (OPJ_UINT32)tilec->x0,
                          opj_uint_ceildiv(tcd->win_x0, image_comp->dx));
    OPJ_UINT32 tcy0 = opj_uint_max(
                          (OPJ_UINT32)tilec->y0,
                          opj_uint_ceildiv(tcd->win_y0, image_comp->dy));
    OPJ_UINT32 tcx1 = opj_uint_min(
                          (OPJ_UINT32)tilec->x1,
                          opj_uint_ceildiv(tcd->win_x1, image_comp->dx));
    OPJ_UINT32 tcy1 = opj_uint_min(
                          (OPJ_UINT32)tilec->y1,
                          opj_uint_ceildiv(tcd->win_y1, image_comp->dy));
    /* Compute number of decomposition for this band. See table F-1 */
    OPJ_UINT32 nb = (resno == 0) ?
                    tilec->numresolutions - 1 :
                    tilec->numresolutions - resno;
    /* Map above tile-based coordinates to sub-band-based coordinates per */
    /* equation B-15 of the standard */
    OPJ_UINT32 x0b = bandno & 1;
    OPJ_UINT32 y0b = bandno >> 1;
    OPJ_UINT32 tbx0 = (nb == 0) ? tcx0 :
                      (tcx0 <= (1U << (nb - 1)) * x0b) ? 0 :
                      opj_uint_ceildivpow2(tcx0 - (1U << (nb - 1)) * x0b, nb);
    OPJ_UINT32 tby0 = (nb == 0) ? tcy0 :
                      (tcy0 <= (1U << (nb - 1)) * y0b) ? 0 :
                      opj_uint_ceildivpow2(tcy0 - (1U << (nb - 1)) * y0b, nb);
    OPJ_UINT32 tbx1 = (nb == 0) ? tcx1 :
                      (tcx1 <= (1U << (nb - 1)) * x0b) ? 0 :
                      opj_uint_ceildivpow2(tcx1 - (1U << (nb - 1)) * x0b, nb);
    OPJ_UINT32 tby1 = (nb == 0) ? tcy1 :
                      (tcy1 <= (1U << (nb - 1)) * y0b) ? 0 :
                      opj_uint_ceildivpow2(tcy1 - (1U << (nb - 1)) * y0b, nb);
    OPJ_BOOL intersects;

    if (tbx0 < filter_margin) {
        tbx0 = 0;
    } else {
        tbx0 -= filter_margin;
    }
    if (tby0 < filter_margin) {
        tby0 = 0;
    } else {
        tby0 -= filter_margin;
    }
    tbx1 = opj_uint_adds(tbx1, filter_margin);
    tby1 = opj_uint_adds(tby1, filter_margin);

    intersects = band_x0 < tbx1 && band_y0 < tby1 && band_x1 > tbx0 &&
                 band_y1 > tby0;

#ifdef DEBUG_VERBOSE
    printf("compno=%u resno=%u nb=%u bandno=%u x0b=%u y0b=%u band=%u,%u,%u,%u tb=%u,%u,%u,%u -> %u\n",
           compno, resno, nb, bandno, x0b, y0b,
           band_x0, band_y0, band_x1, band_y1,
           tbx0, tby0, tbx1, tby1, intersects);
#endif
    return intersects;
}